

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

vector<signed_char,_std::allocator<signed_char>_> *
jsoncons::decode_traits<std::vector<signed_char,std::allocator<signed_char>>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *param_2,error_code *ec)

{
  bool bVar1;
  staj_event_type sVar2;
  basic_staj_event<char> *pbVar3;
  const_iterator puVar4;
  size_t sVar5;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  long *in_RSI;
  vector<signed_char,_std::allocator<signed_char>_> *in_RDI;
  typed_array_visitor<std::vector<signed_char,_std::allocator<signed_char>_>_> visitor;
  uint8_t ch;
  const_iterator __end0;
  const_iterator __begin0;
  byte_string_view *__range5;
  byte_string_view bytes;
  vector<signed_char,_std::allocator<signed_char>_> *v;
  basic_staj_event<char> *in_stack_ffffffffffffff48;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  conv_errc __e;
  error_code *in_stack_ffffffffffffff60;
  error_code *in_stack_ffffffffffffff80;
  basic_staj_event<char> *in_stack_ffffffffffffff88;
  const_iterator local_58;
  byte_string_view local_30;
  error_code *local_20;
  long *local_10;
  
  __e = (conv_errc)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_20 = (error_code *)CONCAT71(in_register_00000009,in_CL);
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x10))();
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (bVar1) {
    memset(in_RDI,0,0x18);
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x3add2c);
  }
  else {
    pbVar3 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
    sVar2 = basic_staj_event<char>::event_type(pbVar3);
    if (sVar2 == byte_string_value) {
      (**(code **)(*local_10 + 0x20))();
      basic_staj_event<char>::get<jsoncons::byte_string_view>
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      bVar1 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar1) {
        memset(in_RDI,0,0x18);
        std::vector<signed_char,_std::allocator<signed_char>_>::vector
                  ((vector<signed_char,_std::allocator<signed_char>_> *)0x3adef0);
      }
      else {
        std::vector<signed_char,_std::allocator<signed_char>_>::vector
                  ((vector<signed_char,_std::allocator<signed_char>_> *)0x3addb4);
        pbVar3 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
        sVar5 = basic_staj_event<char>::size(pbVar3);
        if (sVar5 != 0) {
          pbVar3 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
          sVar5 = basic_staj_event<char>::size(pbVar3);
          decode_traits<std::vector<signed_char,_std::allocator<signed_char>_>,_char,_void>::
          reserve_storage(in_RDI,sVar5);
        }
        local_58 = byte_string_view::begin(&local_30);
        puVar4 = byte_string_view::end(&local_30);
        for (; local_58 != puVar4; local_58 = local_58 + 1) {
          std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                    (in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
        }
        (**(code **)(*local_10 + 0x40))(local_10,local_20);
      }
    }
    else if (sVar2 == begin_array) {
      std::vector<signed_char,_std::allocator<signed_char>_>::vector
                ((vector<signed_char,_std::allocator<signed_char>_> *)0x3adf04);
      pbVar3 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
      sVar5 = basic_staj_event<char>::size(pbVar3);
      if (sVar5 != 0) {
        in_stack_ffffffffffffff48 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
        sVar5 = basic_staj_event<char>::size(in_stack_ffffffffffffff48);
        decode_traits<std::vector<signed_char,_std::allocator<signed_char>_>,_char,_void>::
        reserve_storage(in_RDI,sVar5);
      }
      typed_array_visitor<std::vector<signed_char,_std::allocator<signed_char>_>_>::
      typed_array_visitor((typed_array_visitor<std::vector<signed_char,_std::allocator<signed_char>_>_>
                           *)pbVar3,
                          (vector<signed_char,_std::allocator<signed_char>_> *)
                          in_stack_ffffffffffffff48);
      (**(code **)(*local_10 + 0x30))(local_10,&stack0xffffffffffffff80,local_20);
      typed_array_visitor<std::vector<signed_char,_std::allocator<signed_char>_>_>::
      ~typed_array_visitor
                ((typed_array_visitor<std::vector<signed_char,_std::allocator<signed_char>_>_> *)
                 0x3adfad);
    }
    else {
      std::error_code::operator=(in_stack_ffffffffffffff60,__e);
      memset(in_RDI,0,0x18);
      std::vector<signed_char,_std::allocator<signed_char>_>::vector
                ((vector<signed_char,_std::allocator<signed_char>_> *)0x3ae015);
    }
  }
  return in_RDI;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>&, 
            std::error_code& ec)
        {
            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return T{};
            }
            switch (cursor.current().event_type())
            {
                case staj_event_type::byte_string_value:
                {
                    auto bytes = cursor.current().template get<byte_string_view>(ec);
                    if (!ec) 
                    {
                        T v;
                        if (cursor.current().size() > 0)
                        {
                            reserve_storage(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(), v, cursor.current().size());
                        }
                        for (auto ch : bytes)
                        {
                            v.push_back(static_cast<value_type>(ch));
                        }
                        cursor.next(ec);
                        return v;
                    }
                    else
                    {
                        return T{};
                    }
                }
                case staj_event_type::begin_array:
                {
                    T v;
                    if (cursor.current().size() > 0)
                    {
                        reserve_storage(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(), v, cursor.current().size());
                    }
                    typed_array_visitor<T> visitor(v);
                    cursor.read_to(visitor, ec);
                    return v;
                }
                default:
                {
                    ec = conv_errc::not_vector;
                    return T{};
                }
            }
        }